

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O3

bool __thiscall
tcmalloc::CentralFreeList::ShrinkCache(CentralFreeList *this,int locked_size_class,bool force)

{
  SpinLock *this_00;
  int iVar1;
  undefined8 *puVar2;
  undefined8 *object;
  bool bVar3;
  bool bVar4;
  LockInverter li;
  
  if (this->cache_size_ == 0) {
    return false;
  }
  if ((!force) && (this->used_slots_ == this->cache_size_)) {
    return false;
  }
  this_00 = (SpinLock *)(&Static::central_cache_ + (long)locked_size_class * 0x130);
  LOCK();
  iVar1 = (&Static::central_cache_)[(long)locked_size_class * 0x130];
  (&Static::central_cache_)[(long)locked_size_class * 0x130] = 0;
  UNLOCK();
  if (iVar1 != 1) {
    SpinLock::SlowUnlock(this_00);
  }
  LOCK();
  bVar3 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar3) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar3) {
    SpinLock::SlowLock(&this->lock_);
  }
  iVar1 = this->cache_size_;
  if ((long)iVar1 != 0) {
    if (this->used_slots_ != iVar1) {
      this->cache_size_ = iVar1 + -1;
      bVar3 = true;
      goto LAB_00114367;
    }
    if (force) {
      this->cache_size_ = iVar1 + -1;
      this->used_slots_ = iVar1 + -1;
      bVar3 = true;
      object = (undefined8 *)this->tc_slots_[(long)iVar1 + -1].head;
      while (object != (undefined8 *)0x0) {
        puVar2 = (undefined8 *)*object;
        ReleaseToSpans(this,object);
        object = puVar2;
      }
      goto LAB_00114367;
    }
  }
  bVar3 = false;
LAB_00114367:
  LOCK();
  iVar1 = (this->lock_).lockword_.super___atomic_base<int>._M_i;
  (this->lock_).lockword_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  if (iVar1 != 1) {
    SpinLock::SlowUnlock(&this->lock_);
  }
  LOCK();
  bVar4 = (this_00->lockword_).super___atomic_base<int>._M_i == 0;
  if (bVar4) {
    (this_00->lockword_).super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock(this_00);
  }
  return bVar3;
}

Assistant:

bool CentralFreeList::ShrinkCache(int locked_size_class, bool force)
    NO_THREAD_SAFETY_ANALYSIS {
  // Start with a quick check without taking a lock.
  if (cache_size_ == 0) return false;
  // We don't evict from a full cache unless we are 'forcing'.
  if (force == false && used_slots_ == cache_size_) return false;

  // Grab lock, but first release the other lock held by this thread.  We use
  // the lock inverter to ensure that we never hold two size class locks
  // concurrently.  That can create a deadlock because there is no well
  // defined nesting order.
  LockInverter li(&Static::central_cache()[locked_size_class].lock_, &lock_);
  ASSERT(used_slots_ <= cache_size_);
  ASSERT(0 <= cache_size_);
  if (cache_size_ == 0) return false;
  if (used_slots_ == cache_size_) {
    if (force == false) return false;
    // ReleaseListToSpans releases the lock, so we have to make all the
    // updates to the central list before calling it.
    cache_size_--;
    used_slots_--;
    ReleaseListToSpans(tc_slots_[used_slots_].head);
    return true;
  }
  cache_size_--;
  return true;
}